

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_fwd_txfm2d_16x64_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RSI;
  int row_1;
  int row;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffef50;
  undefined4 local_10a8;
  undefined4 in_stack_ffffffffffffef5c;
  int iVar1;
  int in_stack_fffffffffffff094;
  int32_t *in_stack_fffffffffffff098;
  TXFM_2D_FLIP_CFG *in_stack_fffffffffffff0a0;
  int in_stack_fffffffffffff0ac;
  int32_t *in_stack_fffffffffffff0b0;
  int16_t *in_stack_fffffffffffff0b8;
  
  av1_get_fwd_txfm_cfg
            ((TX_TYPE)((uint)in_stack_ffffffffffffef5c >> 0x18),
             (TX_SIZE)((uint)in_stack_ffffffffffffef5c >> 0x10),in_stack_ffffffffffffef50);
  fwd_txfm2d_c(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
               in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,in_stack_fffffffffffff094);
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    memset((void *)(in_RSI + (long)(iVar1 << 6) * 4 + 0x80),0,0x80);
  }
  for (local_10a8 = 1; local_10a8 < 0x10; local_10a8 = local_10a8 + 1) {
    memcpy((void *)(in_RSI + (long)(local_10a8 << 5) * 4),
           (void *)(in_RSI + (long)(local_10a8 << 6) * 4),0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x64_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(32, int32_t, txfm_buf[64 * 16]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_16X64, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out right 32x16 area.
  for (int row = 0; row < 16; ++row) {
    memset(output + row * 64 + 32, 0, 32 * sizeof(*output));
  }
  // Re-pack non-zero coeffs in the first 32x16 indices.
  for (int row = 1; row < 16; ++row) {
    memcpy(output + row * 32, output + row * 64, 32 * sizeof(*output));
  }
}